

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Handle_Return<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>::
handle<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,void>
          (Handle_Return<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
           *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_28;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *r_local;
  
  local_28.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)r;
  r_local = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)this;
  std::
  make_shared<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (&local_28);
  Boxed_Value::
  Boxed_Value<std::shared_ptr<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,void>
            ((Boxed_Value *)this,
             (shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)&local_28,true);
  std::shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>::
  ~shared_ptr((shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
               *)&local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }